

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O0

void __thiscall sf::Font::Page::Page(Page *this,bool smooth)

{
  byte bVar1;
  byte in_SIL;
  Texture *in_RDI;
  Image *unaff_retaddr;
  Texture *in_stack_00000008;
  uint y;
  uint x;
  Image image;
  Image *in_stack_ffffffffffffff70;
  uint y_00;
  uint in_stack_ffffffffffffff7c;
  undefined1 smooth_00;
  Texture *pTVar2;
  Rect<int> local_60;
  Color local_50;
  uint local_4c;
  uint local_48;
  Color local_44 [9];
  Color *in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  undefined7 in_stack_fffffffffffffff0;
  Texture *area;
  
  bVar1 = in_SIL & 1;
  pTVar2 = in_RDI;
  area = in_RDI;
  std::
  map<unsigned_long_long,_sf::Glyph,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_sf::Glyph>_>_>
  ::map((map<unsigned_long_long,_sf::Glyph,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_sf::Glyph>_>_>
         *)0x1e0605);
  Texture::Texture(pTVar2);
  in_RDI[2].m_actualSize.x = 3;
  pTVar2 = (Texture *)&in_RDI[2].m_texture;
  std::vector<sf::Font::Row,_std::allocator<sf::Font::Row>_>::vector
            ((vector<sf::Font::Row,_std::allocator<sf::Font::Row>_> *)0x1e0634);
  Image::Image(in_stack_ffffffffffffff70);
  Color::Color(local_44,0xff,0xff,0xff,'\0');
  Image::create((Image *)CONCAT17(bVar1,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec,
                in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  for (local_48 = 0; smooth_00 = (undefined1)(in_stack_ffffffffffffff7c >> 0x18), local_48 < 2;
      local_48 = local_48 + 1) {
    for (local_4c = 0; local_4c < 2; local_4c = local_4c + 1) {
      y_00 = local_48;
      in_stack_ffffffffffffff7c = local_4c;
      Color::Color(&local_50,0xff,0xff,0xff,0xff);
      Image::setPixel((Image *)pTVar2,in_stack_ffffffffffffff7c,y_00,
                      (Color *)in_stack_ffffffffffffff70);
    }
  }
  Rect<int>::Rect(&local_60);
  Texture::loadFromImage(in_stack_00000008,unaff_retaddr,(IntRect *)area);
  Texture::setSmooth(pTVar2,(bool)smooth_00);
  Image::~Image((Image *)0x1e0799);
  return;
}

Assistant:

Font::Page::Page(bool smooth) :
nextRow(3)
{
    // Make sure that the texture is initialized by default
    sf::Image image;
    image.create(128, 128, Color(255, 255, 255, 0));

    // Reserve a 2x2 white square for texturing underlines
    for (unsigned int x = 0; x < 2; ++x)
        for (unsigned int y = 0; y < 2; ++y)
            image.setPixel(x, y, Color(255, 255, 255, 255));

    // Create the texture
    texture.loadFromImage(image);
    texture.setSmooth(smooth);
}